

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O1

void BulkTransaction(CMutableTransaction *tx,int32_t target_weight)

{
  uint uVar1;
  pointer pCVar2;
  uint uVar3;
  SizeComputer SVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  CScript *pCVar9;
  long in_FS_OFFSET;
  SizeComputer local_d0;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_c8;
  undefined1 local_b8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_a0 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.m_params = (TransactionSerParams *)((ulong)local_c8.m_params & 0xffffffff00000000);
  local_b8._16_8_ = 0;
  avStack_a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8._0_8_ = (char *)0x0;
  local_b8._8_8_ = 0;
  local_d0.nSize._0_1_ = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8,(iterator)local_b8,
             (uchar *)&local_d0);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx->vout,(int *)&local_c8,(CScript *)local_b8
            );
  if (0x1c < avStack_a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_b8._0_8_);
    local_b8._0_8_ = (char *)0x0;
  }
  CTransaction::CTransaction((CTransaction *)local_b8,tx);
  local_d0.nSize = 0;
  local_c8.m_params = &TX_NO_WITNESS;
  local_c8.m_substream = &local_d0;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_b8,&local_c8,&TX_NO_WITNESS);
  SVar4.nSize = local_d0.nSize;
  local_d0.nSize = 0;
  local_c8.m_params = &TX_WITH_WITNESS;
  local_c8.m_substream = &local_d0;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_b8,&local_c8,&TX_WITH_WITNESS);
  iVar8 = (int)SVar4.nSize * 3 + (int)local_d0.nSize;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_a0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_b8);
  iVar6 = target_weight - iVar8;
  if (target_weight < iVar8) {
    __assert_fail("target_weight >= unpadded_weight",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x4e,"void BulkTransaction(CMutableTransaction &, int32_t)");
  }
  iVar8 = iVar6 + 6;
  if (-1 < iVar6 + 3) {
    iVar8 = iVar6 + 3;
  }
  uVar5 = iVar8 >> 2;
  uVar7 = 0;
  if ((0xfc < uVar5) && (uVar7 = 0xfffffffe, 0xffff < uVar5)) {
    uVar7 = (uint)(-7 < iVar6) << 2 | 0xfffffff8;
  }
  pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = (pCVar2->scriptPubKey).super_CScriptBase._size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  pCVar9 = (CScript *)(pCVar2->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    pCVar9 = &pCVar2->scriptPubKey;
  }
  local_b8[0] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&(pCVar2->scriptPubKey).super_CScriptBase,
             (uchar *)((long)&(pCVar9->super_CScriptBase)._union + (long)(int)uVar3),uVar7 + uVar5,
             local_b8);
  CTransaction::CTransaction((CTransaction *)local_b8,tx);
  local_d0.nSize = 0;
  local_c8.m_params = &TX_NO_WITNESS;
  local_c8.m_substream = &local_d0;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_b8,&local_c8,&TX_NO_WITNESS);
  SVar4.nSize = local_d0.nSize;
  local_d0.nSize = 0;
  local_c8.m_params = &TX_WITH_WITNESS;
  local_c8.m_substream = &local_d0;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_b8,&local_c8,&TX_WITH_WITNESS);
  if (target_weight <= (int)SVar4.nSize * 3 + (int)local_d0.nSize) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_a0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_b8);
    CTransaction::CTransaction((CTransaction *)local_b8,tx);
    local_d0.nSize = 0;
    local_c8.m_params = &TX_NO_WITNESS;
    local_c8.m_substream = &local_d0;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              ((CTransaction *)local_b8,&local_c8,&TX_NO_WITNESS);
    SVar4.nSize = local_d0.nSize;
    local_d0.nSize = 0;
    local_c8.m_params = &TX_WITH_WITNESS;
    local_c8.m_substream = &local_d0;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              ((CTransaction *)local_b8,&local_c8,&TX_WITH_WITNESS);
    if (target_weight + 3 < (int)SVar4.nSize * 3 + (int)local_d0.nSize) {
      __assert_fail("GetTransactionWeight(CTransaction(tx)) <= target_weight + 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                    ,0x5b,"void BulkTransaction(CMutableTransaction &, int32_t)");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_a0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_b8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("GetTransactionWeight(CTransaction(tx)) >= target_weight",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                ,0x5a,"void BulkTransaction(CMutableTransaction &, int32_t)");
}

Assistant:

void BulkTransaction(CMutableTransaction& tx, int32_t target_weight)
{
    tx.vout.emplace_back(0, CScript() << OP_RETURN);
    auto unpadded_weight{GetTransactionWeight(CTransaction(tx))};
    assert(target_weight >= unpadded_weight);

    // determine number of needed padding bytes by converting weight difference to vbytes
    auto dummy_vbytes = (target_weight - unpadded_weight + (WITNESS_SCALE_FACTOR - 1)) / WITNESS_SCALE_FACTOR;
    // compensate for the increase of the compact-size encoded script length
    // (note that the length encoding of the unpadded output script needs one byte)
    dummy_vbytes -= GetSizeOfCompactSize(dummy_vbytes) - 1;

    // pad transaction by repeatedly appending a dummy opcode to the output script
    tx.vout[0].scriptPubKey.insert(tx.vout[0].scriptPubKey.end(), dummy_vbytes, OP_1);

    // actual weight should be at most 3 higher than target weight
    assert(GetTransactionWeight(CTransaction(tx)) >= target_weight);
    assert(GetTransactionWeight(CTransaction(tx)) <= target_weight + 3);
}